

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::gift(Company *this)

{
  int iVar1;
  int iVar2;
  string *psVar3;
  Employee *pEVar4;
  Employee *em;
  string local_38 [36];
  int local_14;
  Company *pCStack_10;
  int i;
  Company *this_local;
  
  local_14 = 0;
  pCStack_10 = this;
  while( true ) {
    iVar2 = local_14;
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= iVar2) break;
    psVar3 = Person::getId_abi_cxx11_(&this->employeeArray[local_14]->super_Person);
    std::__cxx11::string::substr((ulong)local_38,(ulong)psVar3);
    iVar2 = std::__cxx11::stoi(local_38,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)local_38);
    if (iVar2 < 0x5a) {
      pEVar4 = this->employeeArray[local_14];
      iVar2 = Employee::getHourWork(this->employeeArray[local_14]);
      Employee::setHourWork(pEVar4,iVar2 + 5);
    }
    local_14 = local_14 + 1;
  }
  pEVar4 = maxEfficiency(this);
  iVar2 = Employee::getHourWork(pEVar4);
  Employee::setHourWork(pEVar4,iVar2 + 10);
  return;
}

Assistant:

void Company::gift() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        if (stoi(employeeArray[i]->getId().substr(0, 2)) < 90)
            employeeArray[i]->setHourWork(employeeArray[i]->getHourWork() + 5);
    }
    Employee* em=maxEfficiency();//em= employeeArray max
     em->setHourWork(em->getHourWork()+10);
}